

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::SchemaFile::DiskSchemaFile> __thiscall
kj::
heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>&,kj::Own<kj::ReadableFile_const>,kj::Maybe<kj::String>>
          (kj *this,ReadableDirectory *params,Path *params_1,
          ArrayPtr<const_kj::ReadableDirectory_*const> *params_2,
          Own<const_kj::ReadableFile> *params_3,Maybe<kj::String> *params_4)

{
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath;
  DiskSchemaFile *this_00;
  ReadableDirectory *baseDir;
  Path *pPVar1;
  ArrayPtr<const_kj::ReadableDirectory_*const> *pAVar2;
  Own<const_kj::ReadableFile> *other;
  Maybe<kj::String> *other_00;
  DiskSchemaFile *extraout_RDX;
  Own<capnp::SchemaFile::DiskSchemaFile> OVar3;
  Maybe<kj::String> local_98;
  Own<const_kj::ReadableFile> local_78;
  ReadableDirectory **local_68;
  size_t sStack_60;
  Path local_50;
  Maybe<kj::String> *local_38;
  Maybe<kj::String> *params_local_4;
  Own<const_kj::ReadableFile> *params_local_3;
  ArrayPtr<const_kj::ReadableDirectory_*const> *params_local_2;
  Path *params_local_1;
  ReadableDirectory *params_local;
  
  local_38 = params_4;
  params_local_4 = (Maybe<kj::String> *)params_3;
  params_local_3 = (Own<const_kj::ReadableFile> *)params_2;
  params_local_2 = (ArrayPtr<const_kj::ReadableDirectory_*const> *)params_1;
  params_local_1 = (Path *)params;
  params_local = (ReadableDirectory *)this;
  this_00 = (DiskSchemaFile *)operator_new(0x68);
  baseDir = fwd<kj::ReadableDirectory_const&>((ReadableDirectory *)params_local_1);
  pPVar1 = fwd<kj::Path>((NoInfer<kj::Path> *)params_local_2);
  Path::Path(&local_50,pPVar1);
  pAVar2 = fwd<kj::ArrayPtr<kj::ReadableDirectory_const*const>&>
                     ((ArrayPtr<const_kj::ReadableDirectory_*const> *)params_local_3);
  local_68 = pAVar2->ptr;
  sStack_60 = pAVar2->size_;
  other = fwd<kj::Own<kj::ReadableFile_const>>
                    ((NoInfer<kj::Own<const_kj::ReadableFile>_> *)params_local_4);
  Own<const_kj::ReadableFile>::Own(&local_78,other);
  other_00 = fwd<kj::Maybe<kj::String>>(local_38);
  Maybe<kj::String>::Maybe(&local_98,other_00);
  importPath.size_ = sStack_60;
  importPath.ptr = local_68;
  capnp::SchemaFile::DiskSchemaFile::DiskSchemaFile
            (this_00,baseDir,&local_50,importPath,&local_78,&local_98);
  Own<capnp::SchemaFile::DiskSchemaFile>::Own
            ((Own<capnp::SchemaFile::DiskSchemaFile> *)this,this_00,
             (Disposer *)&_::HeapDisposer<capnp::SchemaFile::DiskSchemaFile>::instance);
  Maybe<kj::String>::~Maybe(&local_98);
  Own<const_kj::ReadableFile>::~Own(&local_78);
  Path::~Path(&local_50);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}